

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O1

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_remFromP
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,Index idx)

{
  long lVar1;
  long *plVar2;
  float *pfVar3;
  long lVar4;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  
  if ((((-1 < idx) &&
       (lVar4 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows, idx < lVar4)) && (lVar1 = this->_Np, 0 < lVar1)) &&
     (lVar1 <= lVar4)) {
    plVar2 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar4 = plVar2[idx];
    plVar2[idx] = plVar2[lVar1 + -1];
    plVar2[lVar1 + -1] = lVar4;
    lVar4 = this->_Np + -1;
    this->_Np = lVar4;
    if (idx < lVar4) {
      do {
        if ((this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= idx) goto LAB_0016fe48;
        lVar4 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[idx];
        pfVar3 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        local_68.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
        m_value = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
        local_68.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = pfVar3 + local_68.
                        super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                        .m_rows.m_value * lVar4;
        if (local_68.
            super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
            m_rows.m_value < 0 && pfVar3 != (float *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, Level = 0]"
                       );
        }
        local_68.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startRow.m_value = 0;
        local_68.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             &this->_A;
        local_68.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value = lVar4;
        local_68.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride =
             local_68.
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             m_rows.m_value;
        if ((lVar4 < 0) ||
           ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= lVar4)) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        internal::
        nnls_householder_qr_inplace_update<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
                  (&this->_QR,&this->_qrCoeffs,&local_68,idx,
                   (this->_tempVector).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data);
        idx = idx + 1;
      } while (idx < this->_Np);
    }
    return;
  }
LAB_0016fe48:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<long, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<long, -1, 1>, Level = 1]"
               );
}

Assistant:

void NNLS<MatrixType>::_remFromP(Index idx)
{
#ifdef EIGEN3_NNLS_DEBUG
  std::cerr << "NNLS(): Remove Idx " << _P.indices()(idx) << "@" << idx << " from passive set ("
            << _P.indices().head(_Np).transpose() << ")" << std::endl;
#endif
  // swap index with last passive one & reduce number of passive columns
  std::swap(_P.indices()(idx), _P.indices()(_Np-1)); _Np--;
  // Update QR decomposition starting from the removed index up to the end [idx, ..., _Np]
  for (Index i=idx; i<_Np; i++) {
    Index col = _P.indices()(i);
    internal::nnls_householder_qr_inplace_update(_QR, _qrCoeffs, _A.col(col), i, _tempVector.data());
  }
}